

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O0

void __thiscall gepard::SegmentApproximator::~SegmentApproximator(SegmentApproximator *this)

{
  list<gepard::Segment,_std::allocator<gepard::Segment>_> *this_00;
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  SegmentApproximator *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
       ::begin(&this->_segments);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
         ::end(&this->_segments);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>
             ::operator->(&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (list<gepard::Segment,_std::allocator<gepard::Segment>_> *)0x0) {
      std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::~list(this_00);
      operator_delete(this_00);
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>
    ::operator++(&local_18);
  }
  std::
  map<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
  ::~map(&this->_segments);
  return;
}

Assistant:

SegmentApproximator::~SegmentApproximator()
{
    for (SegmentTree::iterator it = _segments.begin(); it != _segments.end(); ++it) {
        delete it->second;
    }
}